

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.cpp
# Opt level: O3

void __thiscall MyEntity::MyEntity(MyEntity *this,string *n)

{
  MetaSim::Entity::Entity(&this->super_Entity,n);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__MyEntity_0017a7b8;
  this->afirst = false;
  this->bfirst = false;
  this->count = 0;
  MetaSim::Event::Event(&(this->eventA).super_Event,8);
  (this->eventA).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017a800;
  (this->eventA)._obj = this;
  (this->eventA)._fun = (Pmemfun)onEventA;
  *(undefined8 *)&(this->eventA).field_0x98 = 0;
  MetaSim::Event::Event(&(this->eventB).super_Event,8);
  (this->eventB).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017a800;
  (this->eventB)._obj = this;
  (this->eventB)._fun = (Pmemfun)onEventB;
  *(undefined8 *)&(this->eventB).field_0x98 = 0;
  MetaSim::Event::Event(&(this->eventC).super_Event,8);
  (this->eventC).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017a800;
  (this->eventC)._obj = this;
  (this->eventC)._fun = (Pmemfun)onEventC;
  *(undefined8 *)&(this->eventC).field_0x98 = 0;
  return;
}

Assistant:

MyEntity::MyEntity(const std::string &n) : Entity(n),
					   afirst(false),
					   bfirst(false),
					   count(0),
					   eventA(this, &MyEntity::onEventA),
					   eventB(this, &MyEntity::onEventB),
					   eventC(this, &MyEntity::onEventC)
{
}